

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

void __thiscall ON_PostEffects::CImpl::Populate(CImpl *this,Types type)

{
  ON_PostEffects *pe;
  bool bVar1;
  int iVar2;
  ON_XMLNode *post_effects_node;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  undefined4 extraout_var_01;
  ON_PostEffect *this_00;
  wchar_t *pwVar4;
  undefined1 auVar5 [16];
  ON_PostEffect *local_78;
  undefined1 local_70 [8];
  ON_UUID id;
  ON_XMLProperty *prop_id;
  ON_wString local_name;
  ON_XMLProperty *prop_name;
  ON_XMLNode *local_38;
  ON_XMLNode *pep_node;
  ChildIterator it;
  ON_XMLNode *pep_type_node;
  Types type_local;
  CImpl *this_local;
  
  post_effects_node = PostEffectsNode(this);
  it._private = (ON_XMLNodeChildIteratorPrivate *)GetPostEffectTypeNode(post_effects_node,type);
  if ((ON_XMLNode *)it._private != (ON_XMLNode *)0x0) {
    (*((ON_XMLNode *)it._private)->_vptr_ON_XMLNode[0x2c])();
    local_38 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&pep_node);
    while (local_38 != (ON_XMLNode *)0x0) {
      iVar2 = (*local_38->_vptr_ON_XMLNode[3])();
      bVar1 = ::operator==((ON_wString *)CONCAT44(extraout_var,iVar2),L"plug-in");
      if (bVar1) {
        iVar2 = (*local_38->_vptr_ON_XMLNode[0x26])(local_38,L"name");
        local_name.m_s = (wchar_t *)CONCAT44(extraout_var_00,iVar2);
        if (local_name.m_s != (wchar_t *)0x0) {
          plVar3 = (long *)(**(code **)(*(long *)local_name.m_s + 0x38))();
          (**(code **)(*plVar3 + 0x168))(&prop_id);
          id.Data4._0_4_ = (*local_38->_vptr_ON_XMLNode[0x26])(local_38,L"id");
          id.Data4[4] = (char)extraout_var_01;
          id.Data4[5] = (char)((uint)extraout_var_01 >> 8);
          id.Data4[6] = (char)((uint)extraout_var_01 >> 0x10);
          id.Data4[7] = (char)((uint)extraout_var_01 >> 0x18);
          if (id.Data4 != (uchar  [8])0x0) {
            plVar3 = (long *)(**(code **)(*(long *)id.Data4 + 0x38))();
            auVar5 = (**(code **)(*plVar3 + 0x138))();
            id._0_8_ = auVar5._8_8_;
            local_70 = auVar5._0_8_;
            this_00 = (ON_PostEffect *)operator_new(0x10);
            pe = this->_pe;
            pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&prop_id);
            ON_PostEffect::ON_PostEffect(this_00,pe,type,(ON_UUID *)local_70,pwVar4);
            local_78 = this_00;
            ON_SimpleArray<ON_PostEffect_*>::Append(&this->_peps,&local_78);
          }
          ON_wString::~ON_wString((ON_wString *)&prop_id);
        }
      }
      local_38 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&pep_node);
    }
    ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)&pep_node);
  }
  return;
}

Assistant:

void ON_PostEffects::CImpl::Populate(ON_PostEffect::Types type) const
{
  const ON_XMLNode* pep_type_node = GetPostEffectTypeNode(PostEffectsNode(), type);
  if (nullptr == pep_type_node)
    return;

  auto it = pep_type_node->GetChildIterator();

  ON_XMLNode* pep_node = it.GetNextChild();
  while (nullptr != pep_node)
  {
    if (pep_node->TagName() == ON_RDK_PEP_PLUG_IN)
    {
      ON_XMLProperty* prop_name = pep_node->GetNamedProperty(ON_RDK_PEP_LOCAL_NAME);
      if (nullptr != prop_name)
      {
        const ON_wString local_name = prop_name->GetValue().AsString();

        ON_XMLProperty* prop_id = pep_node->GetNamedProperty(ON_RDK_PEP_ID);
        if (nullptr != prop_id)
        {
          const ON_UUID id = prop_id->GetValue().AsUuid();
          _peps.Append(new ON_PostEffect(_pe, type, id, local_name));
        }
      }
    }

    pep_node = it.GetNextChild();
  }
}